

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O1

void get_order_then_remap
               (int size,vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *_edges,
               vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges)

{
  pointer *pppVar1;
  pointer ppVar2;
  iterator __position;
  long lVar3;
  pair<int,_int> *e;
  pointer ppVar4;
  pair<int,_int> *ppVar5;
  ulong uVar6;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  pair<int,_int> *e_1;
  pair<int,_int> local_38;
  
  ppVar2 = (_edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (_edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    order[ppVar4->first].second = order[ppVar4->first].second + 1;
    order[ppVar4->second].second = order[ppVar4->second].second + 1;
  }
  if (0 < size) {
    ppVar5 = order;
    uVar6 = 0;
    do {
      ppVar5->first = (int)uVar6;
      uVar6 = uVar6 + 1;
      ppVar5 = ppVar5 + 1;
    } while ((uint)size != uVar6);
  }
  if (size != 0) {
    uVar6 = (ulong)size;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<std::pair<int,int>*,long,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
              (order,order + uVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>)
               0x1152de);
    std::
    __final_insertion_sort<std::pair<int,int>*,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
              (order,order + uVar6,
               (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>)
               0x1152de);
  }
  if (0 < size) {
    ppVar5 = order;
    uVar6 = 0;
    do {
      ord_map[ppVar5->first] = (int)uVar6;
      uVar6 = uVar6 + 1;
      ppVar5 = ppVar5 + 1;
    } while ((uint)size != uVar6);
  }
  ppVar2 = (_edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (_edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    local_38.second = ord_map[ppVar4->second];
    local_38.first = ord_map[ppVar4->first];
    __position._M_current =
         (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,__position,
                 &local_38);
    }
    else {
      *__position._M_current = local_38;
      pppVar1 = &(edges->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
  }
  return;
}

Assistant:

void get_order_then_remap(int size, const vector<pair<int, int> > &_edges, vector<pair<int, int> > &edges) {
    /* get the order by degree */
    for (auto &e: _edges) {
        ++order[e.first].second;
        ++order[e.second].second;
    }
    for (int i = 0; i < size; ++i) order[i].first = i;
    sort(order, order + size, cmp_order);

    /* remap vertex */
    for (int i = 0; i < size; ++i) ord_map[order[i].first] = i;
    for (auto &e: _edges) {
        edges.push_back(make_pair(ord_map[e.first], ord_map[e.second]));
    }
}